

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O0

HTABLE_NODE *
htable_remove(HTABLE *htable,HTABLE_NODE *key,HTABLE_CMP_FUNC cmp_func,HTABLE_HASH_FUNC hash_func)

{
  HTABLE_NODE *pHVar1;
  HTABLE_CMP_FUNC in_RCX;
  HTABLE_NODE ***in_RDX;
  HTABLE_NODE *in_RSI;
  long in_RDI;
  HTABLE *unaff_retaddr;
  HTABLE_NODE **p_ref;
  HTABLE_NODE *node;
  uint32_t hash;
  undefined8 *local_40;
  HTABLE *in_stack_fffffffffffffff8;
  
  (*in_RCX)(in_RSI,in_RSI);
  pHVar1 = htable_lookup_internal
                     (in_stack_fffffffffffffff8,(uint32_t)((ulong)in_RDI >> 0x20),in_RSI,in_RDX,
                      in_RCX);
  if (pHVar1 == (HTABLE_NODE *)0x0) {
    pHVar1 = (HTABLE_NODE *)0x0;
  }
  else {
    *local_40 = pHVar1->next;
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -1;
    if (*(ulong *)(in_RDI + 0x10) <
        (ulong)(long)((((1 << ((byte)*(undefined4 *)(in_RDI + 8) & 0x1f)) + -1) * 0x3b) / 4)) {
      htable_shrink(unaff_retaddr);
    }
  }
  return pHVar1;
}

Assistant:

HTABLE_NODE*
htable_remove(HTABLE* htable, const HTABLE_NODE* key,
              HTABLE_CMP_FUNC cmp_func, HTABLE_HASH_FUNC hash_func)
{
    uint32_t hash;
    HTABLE_NODE* node;
    HTABLE_NODE** p_ref;

    hash = hash_func(key);
    node = htable_lookup_internal(htable, hash, key, &p_ref, cmp_func);
    if(node == NULL)
        return NULL;

    *p_ref = node->next;
    htable->n--;

    if(HTABLE_TOO_EMPTY(htable))
        htable_shrink(htable);

    return node;
}